

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O2

bool __thiscall
Memory::LargeHeapBlock::VerifyMark(LargeHeapBlock *this,void *objectAddress,void *target)

{
  bool bVar1;
  LargeObjectHeader *pLVar2;
  
  pLVar2 = GetHeader(this,target);
  if ((((LargeObjectHeader *)(this->super_HeapBlock).address <= pLVar2) &&
      (pLVar2->objectIndex < this->allocCount)) &&
     ((LargeObjectHeader *)(&this[1].super_HeapBlock._vptr_HeapBlock)[pLVar2->objectIndex] == pLVar2
     )) {
    bVar1 = HeapBlockMap64::IsMarked(&this->heapInfo->recycler->heapBlockMap,target);
    if (bVar1) {
      return true;
    }
    HeapBlock::PrintVerifyMarkFailure
              (((this->bucket->super_HeapBucket).heapInfo)->recycler,(char *)objectAddress,
               (char *)target);
  }
  return false;
}

Assistant:

bool
LargeHeapBlock::VerifyMark(void * objectAddress, void* target)
{
    LargeObjectHeader * header = GetHeader(target);

    if ((char *)header < this->address)
    {
        return false;
    }

    uint index = header->objectIndex;

    if (index >= this->allocCount)
    {
        // object not allocated
        return false;
    }

    if (this->HeaderList()[index] != header)
    {
        // header doesn't match, not a real object
        return false;
    }

    bool isMarked = this->heapInfo->recycler->heapBlockMap.IsMarked(target);

#if DBG
    if (!isMarked)
    {
        PrintVerifyMarkFailure(this->GetRecycler(), (char*)objectAddress, (char*)target);
    }
#else
    if (!isMarked)
    {
        DebugBreak();
    }
#endif
    return isMarked;
}